

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

void adios2sys::RegExpCompile::regtail(char *p,char *val)

{
  char *p_00;
  ushort uVar1;
  
  if (p != &regdummy) {
    do {
      p_00 = p;
      p = regnext(p_00);
    } while (p != (char *)0x0);
    uVar1 = (short)val - (short)p_00;
    if (*p_00 == '\a') {
      uVar1 = (short)p_00 - (short)val;
    }
    *(ushort *)(p_00 + 1) = uVar1 << 8 | uVar1 >> 8;
  }
  return;
}

Assistant:

void RegExpCompile::regtail(char* p, const char* val)
{
  char* scan;
  char* temp;
  int offset;

  if (p == regdummyptr)
    return;

  // Find last node.
  scan = p;
  for (;;) {
    temp = regnext(scan);
    if (!temp)
      break;
    scan = temp;
  }

  if (OP(scan) == BACK)
    offset = int(scan - val);
  else
    offset = int(val - scan);
  *(scan + 1) = static_cast<char>((offset >> 8) & 0377);
  *(scan + 2) = static_cast<char>(offset & 0377);
}